

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::error_fetch_and_normalize::restore(error_fetch_and_normalize *this)

{
  string *__rhs;
  handle *phVar1;
  PyObject *pPVar2;
  PyObject *pPVar3;
  PyObject *pPVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  error_fetch_and_normalize *local_10;
  error_fetch_and_normalize *this_local;
  
  local_10 = this;
  if ((this->m_restore_called & 1U) != 0) {
    __rhs = error_string_abi_cxx11_(this);
    std::operator+(&local_30,
                   "Internal error: pybind11::detail::error_fetch_and_normalize::restore() called a second time. ORIGINAL ERROR: "
                   ,__rhs);
    pybind11_fail(&local_30);
  }
  phVar1 = handle::inc_ref((handle *)this);
  pPVar2 = handle::ptr(phVar1);
  phVar1 = handle::inc_ref(&(this->m_value).super_handle);
  pPVar3 = handle::ptr(phVar1);
  phVar1 = handle::inc_ref(&(this->m_trace).super_handle);
  pPVar4 = handle::ptr(phVar1);
  PyErr_Restore(pPVar2,pPVar3,pPVar4);
  this->m_restore_called = true;
  return;
}

Assistant:

void restore() {
        if (m_restore_called) {
            pybind11_fail("Internal error: pybind11::detail::error_fetch_and_normalize::restore() "
                          "called a second time. ORIGINAL ERROR: "
                          + error_string());
        }
        PyErr_Restore(m_type.inc_ref().ptr(), m_value.inc_ref().ptr(), m_trace.inc_ref().ptr());
        m_restore_called = true;
    }